

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O0

void __thiscall
mocker::LoopInvariantCodeMotion::hoist
          (LoopInvariantCodeMotion *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *loopNodes,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *invariant,size_t preHeader)

{
  bool bVar1;
  BasicBlock *this_00;
  reference pvVar2;
  BasicBlock *this_01;
  InstList *this_02;
  element_type *this_03;
  ostream *poVar3;
  shared_ptr<mocker::ir::IRInst> *inst_00;
  shared_ptr<mocker::ir::Deleted> local_d0;
  shared_ptr<mocker::ir::IRInst> local_c0 [2];
  string local_a0;
  InstID local_80;
  __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_78;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator __end2;
  iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  value_type_conflict node;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1;
  BasicBlock *preHeaderBB;
  size_t preHeader_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *invariant_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *loopNodes_local;
  LoopInvariantCodeMotion *this_local;
  
  this_00 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,preHeader);
  __end1 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(loopNodes);
  node = (value_type_conflict)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(loopNodes);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<unsigned_long,_false>,
                            (_Node_iterator_base<unsigned_long,_false> *)&node), bVar1) {
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end1);
    this_01 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,*pvVar2);
    this_02 = ir::BasicBlock::getMutableInsts_abi_cxx11_(this_01);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_02);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_02);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      local_78 = (__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      this_03 = std::
                __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_78);
      local_80 = ir::IRInst::getID(this_03);
      bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                        (invariant,&local_80);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"hoist: ");
        ir::fmtInst_abi_cxx11_(&local_a0,(ir *)local_78,inst_00);
        poVar3 = std::operator<<(poVar3,(string *)&local_a0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_a0);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr
                  (local_c0,(shared_ptr<mocker::ir::IRInst> *)local_78);
        ir::BasicBlock::appendInstBeforeTerminator(this_00,local_c0);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(local_c0);
        std::make_shared<mocker::ir::Deleted>();
        std::shared_ptr<mocker::ir::IRInst>::operator=
                  ((shared_ptr<mocker::ir::IRInst> *)local_78,&local_d0);
        std::shared_ptr<mocker::ir::Deleted>::~shared_ptr(&local_d0);
      }
      std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end1);
  }
  removeDeletedInsts((this->super_FuncPass).func);
  return;
}

Assistant:

void LoopInvariantCodeMotion::hoist(
    const std::unordered_set<std::size_t> &loopNodes,
    const std::unordered_set<ir::InstID> &invariant, std::size_t preHeader) {
  auto &preHeaderBB = func.getMutableBasicBlock(preHeader);
  for (auto node : loopNodes) {
    auto &bb = func.getMutableBasicBlock(node);
    for (auto &inst : bb.getMutableInsts()) {
      if (!isIn(invariant, inst->getID()))
        continue;
      std::cerr << "hoist: " << ir::fmtInst(inst) << std::endl;
      preHeaderBB.appendInstBeforeTerminator(inst);
      inst = std::make_shared<ir::Deleted>();
    }
  }
  removeDeletedInsts(func);
}